

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMot<(moira::Mode)6,_1> wrapper)

{
  uint uVar1;
  StrWriter *pSVar2;
  char *local_e8;
  undefined1 local_c0 [8];
  anon_class_16_2_f84c6168 outerDisplacement;
  anon_class_40_5_76b1e68d indexRegister;
  anon_class_24_3_19472836 baseRegister;
  anon_class_24_3_79b1865b baseDisplacement;
  undefined1 local_50 [4];
  u32 outer;
  u32 base;
  ushort local_44;
  u16 iis;
  u16 size;
  u16 is;
  u16 bs;
  u16 scale_1;
  u16 lw_1;
  u16 reg_1;
  An local_34;
  Int local_30;
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  ushort local_24;
  u16 disp;
  u16 scale;
  u16 lw;
  u16 reg;
  u16 full;
  Ea<(moira::Mode)6,_1> *ea;
  StrWriter *this_local;
  IxMot<(moira::Mode)6,_1> wrapper_local;
  
  disp = (ushort)((wrapper.ea)->ext1 >> 8) & 1;
  _scale = wrapper.ea;
  ea = (Ea<(moira::Mode)6,_1> *)this;
  this_local = (StrWriter *)wrapper.ea;
  if (((wrapper.ea)->ext1 & 0x100) == 0) {
    local_24 = (ushort)((wrapper.ea)->ext1 >> 0xc) & 0xf;
    local_26 = (ushort)((wrapper.ea)->ext1 >> 0xb) & 1;
    local_28 = (ushort)((wrapper.ea)->ext1 >> 9) & 3;
    local_2a = (ushort)(wrapper.ea)->ext1 & 0xff;
    pSVar2 = operator<<(this,"(");
    Int::Int(&local_30,(int)(char)local_2a);
    pSVar2 = operator<<(pSVar2,local_30);
    operator<<(pSVar2,",");
    An::An(&local_34,(uint)(ushort)(short)((DasmStyle *)_scale)->letterCase);
    operator<<(this,local_34);
    pSVar2 = operator<<(this,",");
    Rn::Rn((Rn *)&lw_1,(uint)local_24);
    pSVar2 = operator<<(pSVar2,_lw_1);
    if (local_26 == 0) {
      local_e8 = "$%x.w";
    }
    else {
      local_e8 = "$%x.l";
    }
    local_e8 = local_e8 + 3;
    pSVar2 = operator<<(pSVar2,local_e8);
    Scale::Scale((Scale *)&bs,(uint)local_28);
    pSVar2 = operator<<(pSVar2,_bs);
    operator<<(pSVar2,")");
  }
  else {
    is = (ushort)((wrapper.ea)->ext1 >> 0xc) & 0xf;
    size = (ushort)((wrapper.ea)->ext1 >> 0xb) & 1;
    iis = (ushort)((wrapper.ea)->ext1 >> 9) & 3;
    local_44 = (ushort)((wrapper.ea)->ext1 >> 7) & 1;
    base._2_2_ = (ushort)((wrapper.ea)->ext1 >> 6) & 1;
    base._0_2_ = (ushort)((wrapper.ea)->ext1 >> 4) & 3;
    uVar1 = (wrapper.ea)->ext1;
    outer._2_2_ = (ushort)uVar1 & 7;
    local_50 = (undefined1  [4])(wrapper.ea)->ext2;
    baseDisplacement.base._4_4_ = (wrapper.ea)->ext3;
    baseRegister.ea = (Ea<(moira::Mode)6,_1> *)&base;
    baseDisplacement.this = (StrWriter *)local_50;
    indexRegister.scale = &local_44;
    outerDisplacement.outer = (u32 *)((long)&base + 2);
    indexRegister.this = (StrWriter *)&is;
    indexRegister.reg = &size;
    indexRegister.lw = &iis;
    outerDisplacement.this = (StrWriter *)((long)&baseDisplacement.base + 4);
    local_c0 = (undefined1  [8])this;
    indexRegister.is = (u16 *)this;
    baseRegister.bs = (u16 *)this;
    baseRegister.this = (StrWriter *)wrapper.ea;
    baseDisplacement.size = (u16 *)this;
    if ((uVar1 & 7) == 0) {
      operator<<(this,"(");
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_79b1865b::operator()
                ((anon_class_24_3_79b1865b *)&baseRegister.ea);
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_19472836::operator()
                ((anon_class_24_3_19472836 *)&indexRegister.scale);
      operator<<<(moira::Mode)6,_1>::anon_class_40_5_76b1e68d::operator()
                ((anon_class_40_5_76b1e68d *)&outerDisplacement.outer);
      operator<<(this,")");
    }
    else if ((uVar1 & 4) == 0) {
      operator<<(this,"([");
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_79b1865b::operator()
                ((anon_class_24_3_79b1865b *)&baseRegister.ea);
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_19472836::operator()
                ((anon_class_24_3_19472836 *)&indexRegister.scale);
      operator<<<(moira::Mode)6,_1>::anon_class_40_5_76b1e68d::operator()
                ((anon_class_40_5_76b1e68d *)&outerDisplacement.outer);
      operator<<(this,"]");
      operator<<<(moira::Mode)6,_1>::anon_class_16_2_f84c6168::operator()
                ((anon_class_16_2_f84c6168 *)local_c0);
      operator<<(this,")");
    }
    else {
      operator<<(this,"([");
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_79b1865b::operator()
                ((anon_class_24_3_79b1865b *)&baseRegister.ea);
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_19472836::operator()
                ((anon_class_24_3_19472836 *)&indexRegister.scale);
      operator<<(this,"]");
      operator<<<(moira::Mode)6,_1>::anon_class_40_5_76b1e68d::operator()
                ((anon_class_40_5_76b1e68d *)&outerDisplacement.outer);
      operator<<<(moira::Mode)6,_1>::anon_class_16_2_f84c6168::operator()
                ((anon_class_16_2_f84c6168 *)local_c0);
      operator<<(this,")");
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMot<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(" << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                if (!bs) { *this << Sep{} << Pc{}; } else { *this << Sep{} << Zpc{}; }
            } else {
                if (!bs) { *this << Sep{} << An{ea.reg}; }
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Sep{} << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            *this << "(";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            *this << "([";
            baseDisplacement(); baseRegister();
            *this << "]";
            indexRegister(); outerDisplacement();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            *this << "([";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << "]";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}